

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

void __thiscall Tank::initialize(Tank *this,Network *nw)

{
  double dVar1;
  Network *nw_local;
  Tank *this_local;
  
  (this->super_Node).head = this->initHead;
  this->pastHead = this->initHead;
  (this->super_Node).outflow = 0.0;
  this->pastOutflow = 0.0;
  (this->super_Node).quality = (this->super_Node).initQual;
  updateArea(this);
  if (this->volCurve == (Curve *)0x0) {
    if ((this->minVolume == 0.0) && (!NAN(this->minVolume))) {
      this->minVolume = (this->minHead - (this->super_Node).elev) * this->area;
    }
  }
  else {
    dVar1 = findVolume(this,this->minHead);
    this->minVolume = dVar1;
  }
  dVar1 = findVolume(this,(this->super_Node).head);
  this->volume = dVar1;
  dVar1 = findVolume(this,this->maxHead);
  this->maxVolume = dVar1;
  (this->super_Node).fixedGrade = true;
  return;
}

Assistant:

void Tank::initialize(Network* nw)
{
    head = initHead;
    pastHead = initHead;
    outflow = 0.0;
    pastOutflow = 0.0;
    quality = initQual;
    updateArea();
    if ( volCurve ) minVolume = findVolume(minHead);
    else if ( minVolume == 0.0 ) minVolume = (minHead - elev) * area;
    volume = findVolume(head);
    maxVolume = findVolume(maxHead);
    fixedGrade = true;
}